

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

Value * __thiscall
anon_unknown.dwarf_fdcc65::Target::DumpLauncher
          (Value *__return_storage_ptr__,Target *this,char *name,char *type)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  cmValue cVar2;
  cmLocalGenerator *this_01;
  cmake *cmakeInstance;
  string *psVar3;
  Value *pVVar4;
  String *value;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  Value args;
  cmList commandWithArgs;
  string command;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_a8;
  char *local_98;
  ValueHolder local_90;
  undefined8 local_88;
  undefined1 local_80 [24];
  cmGeneratorExpression ge;
  string local_50 [32];
  
  this_00 = this->GT;
  local_98 = type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&args,name,(allocator<char> *)&local_90.bool_);
  cVar2 = cmGeneratorTarget::GetProperty(this_00,(string *)&args);
  std::__cxx11::string::~string((string *)&args);
  Json::Value::Value(__return_storage_ptr__,nullValue);
  if (cVar2.Value != (string *)0x0) {
    this_01 = cmGeneratorTarget::GetLocalGenerator(this->GT);
    cmakeInstance = cmLocalGenerator::GetCMakeInstance(this_01);
    local_a8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_a8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_a8);
    cmGeneratorExpression::cmGeneratorExpression(&ge,cmakeInstance,(cmListFileBacktrace *)&local_a8)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a8.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::string(local_50,(string *)cVar2.Value);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&command,(string *)&ge);
    local_90.string_ = local_80;
    local_88 = 0;
    local_80[0] = 0;
    psVar3 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)command._M_dataplus._M_p,this_01,
                        this->Config,(cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0
                        ,(cmGeneratorTarget *)0x0,(string *)&local_90);
    std::__cxx11::string::string((string *)&args,(string *)psVar3);
    init._M_len = 1;
    init._M_array = (iterator)&args;
    cmList::cmList(&commandWithArgs,init);
    std::__cxx11::string::~string((string *)&args);
    std::__cxx11::string::~string((string *)&local_90.bool_);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&command);
    std::__cxx11::string::~string(local_50);
    if ((commandWithArgs.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         commandWithArgs.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((commandWithArgs.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length != 0)) {
      std::__cxx11::string::string
                ((string *)&command,
                 (string *)
                 commandWithArgs.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      cmsys::SystemTools::ConvertToUnixSlashes(&command);
      Json::Value::Value(&args,objectValue);
      Json::Value::operator=(__return_storage_ptr__,&args);
      Json::Value::~Value(&args);
      cmSystemTools::RelativeIfUnder((string *)&local_90,&this->TopSource,&command);
      Json::Value::Value(&args,(String *)&local_90);
      pVVar4 = Json::Value::operator[](__return_storage_ptr__,"command");
      Json::Value::operator=(pVVar4,&args);
      Json::Value::~Value(&args);
      std::__cxx11::string::~string((string *)&local_90.bool_);
      Json::Value::Value(&args,local_98);
      pVVar4 = Json::Value::operator[](__return_storage_ptr__,"type");
      Json::Value::operator=(pVVar4,&args);
      Json::Value::~Value(&args);
      Json::Value::Value(&args,nullValue);
      value = commandWithArgs.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      while (value = value + 1,
            value != commandWithArgs.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
        Json::Value::Value((Value *)&local_90,value);
        Json::Value::append(&args,(Value *)&local_90);
        Json::Value::~Value((Value *)&local_90);
      }
      bVar1 = Json::Value::empty(&args);
      if (!bVar1) {
        pVVar4 = Json::Value::operator[](__return_storage_ptr__,"arguments");
        Json::Value::operator=(pVVar4,&args);
      }
      Json::Value::~Value(&args);
      std::__cxx11::string::~string((string *)&command);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commandWithArgs.Values);
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpLauncher(const char* name, const char* type)
{
  cmValue property = this->GT->GetProperty(name);
  Json::Value launcher;
  if (property) {
    cmLocalGenerator* lg = this->GT->GetLocalGenerator();
    cmGeneratorExpression ge(*lg->GetCMakeInstance());
    cmList commandWithArgs{ ge.Parse(*property)->Evaluate(lg, this->Config) };
    if (!commandWithArgs.empty() && !commandWithArgs[0].empty()) {
      std::string command(commandWithArgs[0]);
      cmSystemTools::ConvertToUnixSlashes(command);
      launcher = Json::objectValue;
      launcher["command"] = RelativeIfUnder(this->TopSource, command);
      launcher["type"] = type;
      Json::Value args;
      for (std::string const& arg : cmMakeRange(commandWithArgs).advance(1)) {
        args.append(arg);
      }
      if (!args.empty()) {
        launcher["arguments"] = std::move(args);
      }
    }
  }
  return launcher;
}